

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O2

void __thiscall CRollingBloomFilter::reset(CRollingBloomFilter *this)

{
  pointer puVar1;
  uint64_t uVar2;
  pointer puVar3;
  long in_FS_OFFSET;
  FastRandomContext local_a0;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&local_a0,false);
  uVar2 = RandomMixin<FastRandomContext>::randbits<32>
                    (&local_a0.super_RandomMixin<FastRandomContext>);
  this->nTweak = (uint)uVar2;
  ChaCha20::~ChaCha20(&local_a0.rng);
  this->nEntriesThisGeneration = 0;
  this->nGeneration = 1;
  puVar1 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    *puVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRollingBloomFilter::reset()
{
    nTweak = FastRandomContext().rand<unsigned int>();
    nEntriesThisGeneration = 0;
    nGeneration = 1;
    std::fill(data.begin(), data.end(), 0);
}